

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O0

void aes_init_x86(aes_context *ctx,uint8_t *key)

{
  undefined8 uVar1;
  ulong uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined8 uStack_bb8;
  __m128i _t_22;
  __m128i _s_22;
  __m128i _t_21;
  __m128i _s_21;
  __m128i _t_20;
  __m128i _s_20;
  __m128i _t_19;
  __m128i _s_19;
  __m128i _t_18;
  __m128i _s_18;
  __m128i _t_17;
  __m128i _s_17;
  __m128i _t_16;
  __m128i _s_16;
  __m128i _t_15;
  __m128i _s_15;
  __m128i _t_14;
  __m128i _s_14;
  __m128i _t_13;
  __m128i _s_13;
  __m128i _t_12;
  __m128i _s_12;
  __m128i _t_11;
  __m128i _s_11;
  __m128i _t_10;
  __m128i _s_10;
  __m128i _t_9;
  __m128i _s_9;
  __m128i _t_8;
  __m128i _s_8;
  __m128i _t_7;
  __m128i _s_7;
  __m128i _t_6;
  __m128i _s_6;
  __m128i _t_5;
  __m128i _s_5;
  __m128i _t_4;
  __m128i _s_4;
  __m128i _t_3;
  __m128i _s_3;
  __m128i _t_2;
  __m128i _s_2;
  __m128i _t_1;
  __m128i _s_1;
  __m128i _t;
  __m128i _s;
  __m128i *ekey;
  uint8_t *key_local;
  aes_context *ctx_local;
  
  puVar3 = ctx->key;
  if (ctx->nr == 10) {
    uVar1 = *(undefined8 *)(key + 8);
    *(undefined8 *)puVar3 = *(undefined8 *)key;
    *(undefined8 *)(ctx->key + 2) = uVar1;
    uVar2 = *(ulong *)puVar3;
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])puVar3,1);
    _t[0]._4_4_ = auVar5._12_4_;
    _s_1[1] = CONCAT44(_t[0]._4_4_,_t[0]._4_4_);
    _t[0]._0_4_ = _t[0]._4_4_;
    *(ulong *)(ctx->key + 4) = uVar4 ^ _s_1[1];
    *(ulong *)(ctx->key + 6) =
         *(ulong *)(ctx->key + 2) ^ (*(ulong *)(ctx->key + 2) << 0x20 | uVar2 >> 0x20) ^ uVar4 ^
         _t[0];
    uVar2 = *(ulong *)(ctx->key + 4);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 4),2);
    _t_1[0]._4_4_ = auVar5._12_4_;
    _s_2[1] = CONCAT44(_t_1[0]._4_4_,_t_1[0]._4_4_);
    _t_1[0]._0_4_ = _t_1[0]._4_4_;
    *(ulong *)(ctx->key + 8) = uVar4 ^ _s_2[1];
    *(ulong *)(ctx->key + 10) =
         *(ulong *)(ctx->key + 6) ^ (*(ulong *)(ctx->key + 6) << 0x20 | uVar2 >> 0x20) ^ uVar4 ^
         _t_1[0];
    uVar2 = *(ulong *)(ctx->key + 8);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 8),4);
    _t_2[0]._4_4_ = auVar5._12_4_;
    _s_3[1] = CONCAT44(_t_2[0]._4_4_,_t_2[0]._4_4_);
    _t_2[0]._0_4_ = _t_2[0]._4_4_;
    *(ulong *)(ctx->key + 0xc) = uVar4 ^ _s_3[1];
    *(ulong *)(ctx->key + 0xe) =
         *(ulong *)(ctx->key + 10) ^ (*(ulong *)(ctx->key + 10) << 0x20 | uVar2 >> 0x20) ^ uVar4 ^
         _t_2[0];
    uVar2 = *(ulong *)(ctx->key + 0xc);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0xc),8);
    _t_3[0]._4_4_ = auVar5._12_4_;
    _s_4[1] = CONCAT44(_t_3[0]._4_4_,_t_3[0]._4_4_);
    _t_3[0]._0_4_ = _t_3[0]._4_4_;
    *(ulong *)(ctx->key + 0x10) = uVar4 ^ _s_4[1];
    *(ulong *)(ctx->key + 0x12) =
         *(ulong *)(ctx->key + 0xe) ^ (*(ulong *)(ctx->key + 0xe) << 0x20 | uVar2 >> 0x20) ^ uVar4 ^
         _t_3[0];
    uVar2 = *(ulong *)(ctx->key + 0x10);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x10),0x10);
    _t_4[0]._4_4_ = auVar5._12_4_;
    _s_5[1] = CONCAT44(_t_4[0]._4_4_,_t_4[0]._4_4_);
    _t_4[0]._0_4_ = _t_4[0]._4_4_;
    *(ulong *)(ctx->key + 0x14) = uVar4 ^ _s_5[1];
    *(ulong *)(ctx->key + 0x16) =
         *(ulong *)(ctx->key + 0x12) ^ (*(ulong *)(ctx->key + 0x12) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_4[0];
    uVar2 = *(ulong *)(ctx->key + 0x14);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x14),0x20);
    _t_5[0]._4_4_ = auVar5._12_4_;
    _s_6[1] = CONCAT44(_t_5[0]._4_4_,_t_5[0]._4_4_);
    _t_5[0]._0_4_ = _t_5[0]._4_4_;
    *(ulong *)(ctx->key + 0x18) = uVar4 ^ _s_6[1];
    *(ulong *)(ctx->key + 0x1a) =
         *(ulong *)(ctx->key + 0x16) ^ (*(ulong *)(ctx->key + 0x16) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_5[0];
    uVar2 = *(ulong *)(ctx->key + 0x18);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x18),0x40);
    _t_6[0]._4_4_ = auVar5._12_4_;
    _s_7[1] = CONCAT44(_t_6[0]._4_4_,_t_6[0]._4_4_);
    _t_6[0]._0_4_ = _t_6[0]._4_4_;
    *(ulong *)(ctx->key + 0x1c) = uVar4 ^ _s_7[1];
    *(ulong *)(ctx->key + 0x1e) =
         *(ulong *)(ctx->key + 0x1a) ^ (*(ulong *)(ctx->key + 0x1a) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_6[0];
    uVar2 = *(ulong *)(ctx->key + 0x1c);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x1c),0x80);
    _t_7[0]._4_4_ = auVar5._12_4_;
    _s_8[1] = CONCAT44(_t_7[0]._4_4_,_t_7[0]._4_4_);
    _t_7[0]._0_4_ = _t_7[0]._4_4_;
    *(ulong *)(ctx->key + 0x20) = uVar4 ^ _s_8[1];
    *(ulong *)(ctx->key + 0x22) =
         *(ulong *)(ctx->key + 0x1e) ^ (*(ulong *)(ctx->key + 0x1e) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_7[0];
    uVar2 = *(ulong *)(ctx->key + 0x20);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x20),0x1b);
    _t_8[0]._4_4_ = auVar5._12_4_;
    _s_9[1] = CONCAT44(_t_8[0]._4_4_,_t_8[0]._4_4_);
    _t_8[0]._0_4_ = _t_8[0]._4_4_;
    *(ulong *)(ctx->key + 0x24) = uVar4 ^ _s_9[1];
    *(ulong *)(ctx->key + 0x26) =
         *(ulong *)(ctx->key + 0x22) ^ (*(ulong *)(ctx->key + 0x22) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_8[0];
    uVar2 = *(ulong *)(ctx->key + 0x24);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x24),0x36);
    _t_9[0]._4_4_ = auVar5._12_4_;
    _s_10[1] = CONCAT44(_t_9[0]._4_4_,_t_9[0]._4_4_);
    _t_9[0]._0_4_ = _t_9[0]._4_4_;
    *(ulong *)(ctx->key + 0x28) = uVar4 ^ _s_10[1];
    *(ulong *)(ctx->key + 0x2a) =
         *(ulong *)(ctx->key + 0x26) ^ (*(ulong *)(ctx->key + 0x26) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_9[0];
  }
  else {
    uVar1 = *(undefined8 *)(key + 8);
    *(undefined8 *)puVar3 = *(undefined8 *)key;
    *(undefined8 *)(ctx->key + 2) = uVar1;
    uVar1 = *(undefined8 *)(key + 0x18);
    *(undefined8 *)(ctx->key + 4) = *(undefined8 *)(key + 0x10);
    *(undefined8 *)(ctx->key + 6) = uVar1;
    uVar2 = *(ulong *)puVar3;
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 4),1);
    _t_10[0]._4_4_ = auVar5._12_4_;
    _s_11[1] = CONCAT44(_t_10[0]._4_4_,_t_10[0]._4_4_);
    _t_10[0]._0_4_ = _t_10[0]._4_4_;
    *(ulong *)(ctx->key + 8) = uVar4 ^ _s_11[1];
    *(ulong *)(ctx->key + 10) =
         *(ulong *)(ctx->key + 2) ^ (*(ulong *)(ctx->key + 2) << 0x20 | uVar2 >> 0x20) ^ uVar4 ^
         _t_10[0];
    uVar2 = *(ulong *)(ctx->key + 4);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 8),0);
    _t_11[0]._0_4_ = auVar5._8_4_;
    _s_12[1] = CONCAT44((undefined4)_t_11[0],(undefined4)_t_11[0]);
    _t_11[0]._4_4_ = (undefined4)_t_11[0];
    *(ulong *)(ctx->key + 0xc) = uVar4 ^ _s_12[1];
    *(ulong *)(ctx->key + 0xe) =
         *(ulong *)(ctx->key + 6) ^ (*(ulong *)(ctx->key + 6) << 0x20 | uVar2 >> 0x20) ^ uVar4 ^
         _t_11[0];
    uVar2 = *(ulong *)(ctx->key + 8);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0xc),2);
    _t_12[0]._4_4_ = auVar5._12_4_;
    _s_13[1] = CONCAT44(_t_12[0]._4_4_,_t_12[0]._4_4_);
    _t_12[0]._0_4_ = _t_12[0]._4_4_;
    *(ulong *)(ctx->key + 0x10) = uVar4 ^ _s_13[1];
    *(ulong *)(ctx->key + 0x12) =
         *(ulong *)(ctx->key + 10) ^ (*(ulong *)(ctx->key + 10) << 0x20 | uVar2 >> 0x20) ^ uVar4 ^
         _t_12[0];
    uVar2 = *(ulong *)(ctx->key + 0xc);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x10),0);
    _t_13[0]._0_4_ = auVar5._8_4_;
    _s_14[1] = CONCAT44((undefined4)_t_13[0],(undefined4)_t_13[0]);
    _t_13[0]._4_4_ = (undefined4)_t_13[0];
    *(ulong *)(ctx->key + 0x14) = uVar4 ^ _s_14[1];
    *(ulong *)(ctx->key + 0x16) =
         *(ulong *)(ctx->key + 0xe) ^ (*(ulong *)(ctx->key + 0xe) << 0x20 | uVar2 >> 0x20) ^ uVar4 ^
         _t_13[0];
    uVar2 = *(ulong *)(ctx->key + 0x10);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x14),4);
    _t_14[0]._4_4_ = auVar5._12_4_;
    _s_15[1] = CONCAT44(_t_14[0]._4_4_,_t_14[0]._4_4_);
    _t_14[0]._0_4_ = _t_14[0]._4_4_;
    *(ulong *)(ctx->key + 0x18) = uVar4 ^ _s_15[1];
    *(ulong *)(ctx->key + 0x1a) =
         *(ulong *)(ctx->key + 0x12) ^ (*(ulong *)(ctx->key + 0x12) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_14[0];
    uVar2 = *(ulong *)(ctx->key + 0x14);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x18),0);
    _t_15[0]._0_4_ = auVar5._8_4_;
    _s_16[1] = CONCAT44((undefined4)_t_15[0],(undefined4)_t_15[0]);
    _t_15[0]._4_4_ = (undefined4)_t_15[0];
    *(ulong *)(ctx->key + 0x1c) = uVar4 ^ _s_16[1];
    *(ulong *)(ctx->key + 0x1e) =
         *(ulong *)(ctx->key + 0x16) ^ (*(ulong *)(ctx->key + 0x16) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_15[0];
    uVar2 = *(ulong *)(ctx->key + 0x18);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x1c),8);
    _t_16[0]._4_4_ = auVar5._12_4_;
    _s_17[1] = CONCAT44(_t_16[0]._4_4_,_t_16[0]._4_4_);
    _t_16[0]._0_4_ = _t_16[0]._4_4_;
    *(ulong *)(ctx->key + 0x20) = uVar4 ^ _s_17[1];
    *(ulong *)(ctx->key + 0x22) =
         *(ulong *)(ctx->key + 0x1a) ^ (*(ulong *)(ctx->key + 0x1a) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_16[0];
    uVar2 = *(ulong *)(ctx->key + 0x1c);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x20),0);
    _t_17[0]._0_4_ = auVar5._8_4_;
    _s_18[1] = CONCAT44((undefined4)_t_17[0],(undefined4)_t_17[0]);
    _t_17[0]._4_4_ = (undefined4)_t_17[0];
    *(ulong *)(ctx->key + 0x24) = uVar4 ^ _s_18[1];
    *(ulong *)(ctx->key + 0x26) =
         *(ulong *)(ctx->key + 0x1e) ^ (*(ulong *)(ctx->key + 0x1e) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_17[0];
    uVar2 = *(ulong *)(ctx->key + 0x20);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x24),0x10);
    _t_18[0]._4_4_ = auVar5._12_4_;
    _s_19[1] = CONCAT44(_t_18[0]._4_4_,_t_18[0]._4_4_);
    _t_18[0]._0_4_ = _t_18[0]._4_4_;
    *(ulong *)(ctx->key + 0x28) = uVar4 ^ _s_19[1];
    *(ulong *)(ctx->key + 0x2a) =
         *(ulong *)(ctx->key + 0x22) ^ (*(ulong *)(ctx->key + 0x22) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_18[0];
    uVar2 = *(ulong *)(ctx->key + 0x24);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x28),0);
    _t_19[0]._0_4_ = auVar5._8_4_;
    _s_20[1] = CONCAT44((undefined4)_t_19[0],(undefined4)_t_19[0]);
    _t_19[0]._4_4_ = (undefined4)_t_19[0];
    *(ulong *)(ctx->key + 0x2c) = uVar4 ^ _s_20[1];
    *(ulong *)(ctx->key + 0x2e) =
         *(ulong *)(ctx->key + 0x26) ^ (*(ulong *)(ctx->key + 0x26) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_19[0];
    uVar2 = *(ulong *)(ctx->key + 0x28);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x2c),0x20);
    _t_20[0]._4_4_ = auVar5._12_4_;
    _s_21[1] = CONCAT44(_t_20[0]._4_4_,_t_20[0]._4_4_);
    _t_20[0]._0_4_ = _t_20[0]._4_4_;
    *(ulong *)(ctx->key + 0x30) = uVar4 ^ _s_21[1];
    *(ulong *)(ctx->key + 0x32) =
         *(ulong *)(ctx->key + 0x2a) ^ (*(ulong *)(ctx->key + 0x2a) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_20[0];
    uVar2 = *(ulong *)(ctx->key + 0x2c);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x30),0);
    _t_21[0]._0_4_ = auVar5._8_4_;
    _s_22[1] = CONCAT44((undefined4)_t_21[0],(undefined4)_t_21[0]);
    _t_21[0]._4_4_ = (undefined4)_t_21[0];
    *(ulong *)(ctx->key + 0x34) = uVar4 ^ _s_22[1];
    *(ulong *)(ctx->key + 0x36) =
         *(ulong *)(ctx->key + 0x2e) ^ (*(ulong *)(ctx->key + 0x2e) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_21[0];
    uVar2 = *(ulong *)(ctx->key + 0x30);
    uVar4 = uVar2 ^ uVar2 << 0x20;
    auVar5 = aeskeygenassist(*(undefined1 (*) [16])(ctx->key + 0x34),0x40);
    _t_22[0]._4_4_ = auVar5._12_4_;
    uStack_bb8 = CONCAT44(_t_22[0]._4_4_,_t_22[0]._4_4_);
    _t_22[0]._0_4_ = _t_22[0]._4_4_;
    *(ulong *)(ctx->key + 0x38) = uVar4 ^ uStack_bb8;
    *(ulong *)(ctx->key + 0x3a) =
         *(ulong *)(ctx->key + 0x32) ^ (*(ulong *)(ctx->key + 0x32) << 0x20 | uVar2 >> 0x20) ^ uVar4
         ^ _t_22[0];
  }
  return;
}

Assistant:

void aes_init_x86(aes_context* ctx, const uint8_t* key)
{
  __m128i* ekey = (__m128i*)ctx->key;

  if (ctx->nr == 10) {
    ekey[0] = _mm_loadu_si128((const __m128i*)key);
    AES_INIT_128(ekey, 0, 0x01);
    AES_INIT_128(ekey, 1, 0x02);
    AES_INIT_128(ekey, 2, 0x04);
    AES_INIT_128(ekey, 3, 0x08);
    AES_INIT_128(ekey, 4, 0x10);
    AES_INIT_128(ekey, 5, 0x20);
    AES_INIT_128(ekey, 6, 0x40);
    AES_INIT_128(ekey, 7, 0x80);
    AES_INIT_128(ekey, 8, 0x1b);
    AES_INIT_128(ekey, 9, 0x36);
  } else {
    ekey[0] = _mm_loadu_si128((const __m128i*)key);
    ekey[1] = _mm_loadu_si128((const __m128i*)(key+16));
    AES_INIT_256(ekey, 0,  0xFF, 0x01);
    AES_INIT_256(ekey, 1,  0xAA, 0x00);
    AES_INIT_256(ekey, 2,  0xFF, 0x02);
    AES_INIT_256(ekey, 3,  0xAA, 0x00);
    AES_INIT_256(ekey, 4,  0xFF, 0x04);
    AES_INIT_256(ekey, 5,  0xAA, 0x00);
    AES_INIT_256(ekey, 6,  0xFF, 0x08);
    AES_INIT_256(ekey, 7,  0xAA, 0x00);
    AES_INIT_256(ekey, 8,  0xFF, 0x10);
    AES_INIT_256(ekey, 9,  0xAA, 0x00);
    AES_INIT_256(ekey, 10, 0xFF, 0x20);
    AES_INIT_256(ekey, 11, 0xAA, 0x00);
    AES_INIT_256(ekey, 12, 0xFF, 0x40);
  }
}